

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void __thiscall
Assimp::Discreet3DSImporter::GenerateNodeGraph(Discreet3DSImporter *this,aiScene *pcOut)

{
  uint uVar1;
  undefined1 auVar2 [16];
  ai_uint32 aVar3;
  aiNode *paVar4;
  size_type sVar5;
  Logger *this_00;
  size_type sVar6;
  ulong uVar7;
  aiNode **ppaVar8;
  uint *puVar9;
  reference ppaVar10;
  reference ppaVar11;
  aiAnimation **ppaVar12;
  aiAnimation *this_01;
  void *pvVar13;
  char *pcVar14;
  aiMatrix4x4t<float> local_12c;
  aiMatrix4x4t<float> local_ec;
  uint local_ac;
  undefined1 local_a8 [4];
  uint a_1;
  aiMatrix4x4 m;
  aiAnimation *anim;
  aiNode *paStack_58;
  uint numChannel;
  aiNode *pcNode_2;
  aiNode *paStack_48;
  uint i_2;
  aiNode *pcNode_1;
  aiNode *paStack_38;
  uint i_1;
  aiNode *pcNode;
  uint local_28;
  uint i;
  uint a;
  aiScene *local_18;
  aiScene *pcOut_local;
  Discreet3DSImporter *this_local;
  
  local_18 = pcOut;
  pcOut_local = (aiScene *)this;
  paVar4 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar4);
  local_18->mRootNode = paVar4;
  sVar5 = std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::size
                    (&this->mRootNode->mChildren);
  if (sVar5 == 0) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"No hierarchy information has been found in the file. ");
    uVar1 = local_18->mNumMeshes;
    sVar5 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(&this->mScene->mCameras);
    sVar6 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(&this->mScene->mLights);
    local_18->mRootNode->mNumChildren = uVar1 + (int)sVar5 + (int)sVar6;
    auVar2 = ZEXT416(local_18->mRootNode->mNumChildren) * ZEXT816(8);
    uVar7 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    ppaVar8 = (aiNode **)operator_new__(uVar7);
    local_18->mRootNode->mChildren = ppaVar8;
    aiString::Set(&local_18->mRootNode->mName,"<3DSDummyRoot>");
    local_28 = 0;
    for (pcNode._4_4_ = 0; pcNode._4_4_ < local_18->mNumMeshes; pcNode._4_4_ = pcNode._4_4_ + 1) {
      paVar4 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar4);
      local_18->mRootNode->mChildren[local_28] = paVar4;
      paVar4->mParent = local_18->mRootNode;
      paStack_38 = paVar4;
      puVar9 = (uint *)operator_new__(4);
      paStack_38->mMeshes = puVar9;
      *paStack_38->mMeshes = pcNode._4_4_;
      paStack_38->mNumMeshes = 1;
      aVar3 = snprintf((paStack_38->mName).data,0x400,"3DSMesh_%u",(ulong)pcNode._4_4_);
      (paStack_38->mName).length = aVar3;
      local_28 = local_28 + 1;
    }
    for (pcNode_1._4_4_ = 0; uVar1 = pcNode_1._4_4_,
        sVar5 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::size(&this->mScene->mCameras),
        uVar1 < (uint)sVar5; pcNode_1._4_4_ = pcNode_1._4_4_ + 1) {
      paVar4 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar4);
      local_18->mRootNode->mChildren[local_28] = paVar4;
      paVar4->mParent = local_18->mRootNode;
      paStack_48 = paVar4;
      ppaVar10 = std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::operator[]
                           (&this->mScene->mCameras,(ulong)pcNode_1._4_4_);
      aiString::operator=(&paStack_48->mName,&(*ppaVar10)->mName);
      local_28 = local_28 + 1;
    }
    for (pcNode_2._4_4_ = 0; uVar1 = pcNode_2._4_4_,
        sVar5 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size(&this->mScene->mLights),
        uVar1 < (uint)sVar5; pcNode_2._4_4_ = pcNode_2._4_4_ + 1) {
      paVar4 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar4);
      local_18->mRootNode->mChildren[local_28] = paVar4;
      paVar4->mParent = local_18->mRootNode;
      paStack_58 = paVar4;
      ppaVar11 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::operator[]
                           (&this->mScene->mLights,(ulong)pcNode_2._4_4_);
      aiString::operator=(&paStack_58->mName,&(*ppaVar11)->mName);
      local_28 = local_28 + 1;
    }
  }
  else {
    anim._4_4_ = 0;
    CountTracks(this->mRootNode,(uint *)((long)&anim + 4));
    if (anim._4_4_ != 0) {
      local_18->mNumAnimations = 1;
      ppaVar12 = (aiAnimation **)operator_new__(8);
      local_18->mAnimations = ppaVar12;
      this_01 = (aiAnimation *)operator_new(0x448);
      aiAnimation::aiAnimation(this_01);
      *local_18->mAnimations = this_01;
      m._56_8_ = this_01;
      aiString::Set((aiString *)this_01,"3DSMasterAnim");
      uVar7 = SUB168(ZEXT416(anim._4_4_) * ZEXT816(8),0);
      if (SUB168(ZEXT416(anim._4_4_) * ZEXT816(8),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      pvVar13 = operator_new__(uVar7);
      *(void **)(m._56_8_ + 0x420) = pvVar13;
    }
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_a8);
    AddNodeToGraph(this,local_18,local_18->mRootNode,this->mRootNode,(aiMatrix4x4 *)local_a8);
  }
  for (local_ac = 0; local_ac < local_18->mNumMeshes; local_ac = local_ac + 1) {
    local_18->mMeshes[local_ac]->mColors[0] = (aiColor4D *)0x0;
    local_18->mMeshes[local_ac]->mColors[1] = (aiColor4D *)0x0;
  }
  aiMatrix4x4t<float>::aiMatrix4x4t
            (&local_12c,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,-1.0,0.0,0.0,0.0,0.0,0.0,1.0);
  aiMatrix4x4t<float>::operator*(&local_ec,&local_12c,&local_18->mRootNode->mTransformation);
  memcpy(&local_18->mRootNode->mTransformation,&local_ec,0x40);
  pcVar14 = strstr((local_18->mRootNode->mName).data,"UNNAMED");
  if ((pcVar14 != (char *)0x0) ||
     (((local_18->mRootNode->mName).data[0] == '$' && ((local_18->mRootNode->mName).data[1] == '$'))
     )) {
    aiString::Set(&local_18->mRootNode->mName,"<3DSRoot>");
  }
  return;
}

Assistant:

void Discreet3DSImporter::GenerateNodeGraph(aiScene* pcOut)
{
    pcOut->mRootNode = new aiNode();
    if (0 == mRootNode->mChildren.size())
    {
        //////////////////////////////////////////////////////////////////////////////
        // It seems the file is so messed up that it has not even a hierarchy.
        // generate a flat hiearachy which looks like this:
        //
        //                ROOT_NODE
        //                   |
        //   ----------------------------------------
        //   |       |       |            |         |
        // MESH_0  MESH_1  MESH_2  ...  MESH_N    CAMERA_0 ....
        //
        ASSIMP_LOG_WARN("No hierarchy information has been found in the file. ");

        pcOut->mRootNode->mNumChildren = pcOut->mNumMeshes +
            static_cast<unsigned int>(mScene->mCameras.size() + mScene->mLights.size());

        pcOut->mRootNode->mChildren = new aiNode* [ pcOut->mRootNode->mNumChildren ];
        pcOut->mRootNode->mName.Set("<3DSDummyRoot>");

        // Build dummy nodes for all meshes
        unsigned int a = 0;
        for (unsigned int i = 0; i < pcOut->mNumMeshes;++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;
            pcNode->mMeshes = new unsigned int[1];
            pcNode->mMeshes[0] = i;
            pcNode->mNumMeshes = 1;

            // Build a name for the node
            pcNode->mName.length = ai_snprintf(pcNode->mName.data, MAXLEN, "3DSMesh_%u",i);
        }

        // Build dummy nodes for all cameras
        for (unsigned int i = 0; i < (unsigned int )mScene->mCameras.size();++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;

            // Build a name for the node
            pcNode->mName = mScene->mCameras[i]->mName;
        }

        // Build dummy nodes for all lights
        for (unsigned int i = 0; i < (unsigned int )mScene->mLights.size();++i,++a)
        {
            aiNode* pcNode = pcOut->mRootNode->mChildren[a] = new aiNode();
            pcNode->mParent = pcOut->mRootNode;

            // Build a name for the node
            pcNode->mName = mScene->mLights[i]->mName;
        }
    }
    else
    {
        // First of all: find out how many scaling, rotation and translation
        // animation tracks we'll have afterwards
        unsigned int numChannel = 0;
        CountTracks(mRootNode,numChannel);

        if (numChannel)
        {
            // Allocate a primary animation channel
            pcOut->mNumAnimations = 1;
            pcOut->mAnimations    = new aiAnimation*[1];
            aiAnimation* anim     = pcOut->mAnimations[0] = new aiAnimation();

            anim->mName.Set("3DSMasterAnim");

            // Allocate enough storage for all node animation channels,
            // but don't set the mNumChannels member - we'll use it to
            // index into the array
            anim->mChannels = new aiNodeAnim*[numChannel];
        }

        aiMatrix4x4 m;
        AddNodeToGraph(pcOut,  pcOut->mRootNode, mRootNode,m);
    }

    // We used the first and second vertex color set to store some temporary values so we need to cleanup here
    for (unsigned int a = 0; a < pcOut->mNumMeshes; ++a)
    {
        pcOut->mMeshes[a]->mColors[0] = NULL;
        pcOut->mMeshes[a]->mColors[1] = NULL;
    }

    pcOut->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f) * pcOut->mRootNode->mTransformation;

    // If the root node is unnamed name it "<3DSRoot>"
    if (::strstr( pcOut->mRootNode->mName.data, "UNNAMED" ) ||
        (pcOut->mRootNode->mName.data[0] == '$' && pcOut->mRootNode->mName.data[1] == '$') )
    {
        pcOut->mRootNode->mName.Set("<3DSRoot>");
    }
}